

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O3

void cf_hmac(uint8_t *key,size_t nkey,uint8_t *msg,size_t nmsg,uint8_t *out,cf_chash *hash)

{
  cf_hmac_ctx ctx;
  cf_hmac_ctx local_2f8;
  
  if ((out != (uint8_t *)0x0) && (hash != (cf_chash *)0x0)) {
    cf_hmac_init(&local_2f8,hash,key,nkey);
    if (local_2f8.hash != (cf_chash *)0x0) {
      (*(local_2f8.hash)->update)(&local_2f8.inner,msg,nmsg);
      cf_hmac_finish(&local_2f8,out);
      return;
    }
  }
  abort();
}

Assistant:

void cf_hmac(const uint8_t *key, size_t nkey,
             const uint8_t *msg, size_t nmsg,
             uint8_t *out,
             const cf_chash *hash)
{
  cf_hmac_ctx ctx;
  
  assert(out);
  assert(hash);

  cf_hmac_init(&ctx, hash, key, nkey);
  cf_hmac_update(&ctx, msg, nmsg);
  cf_hmac_finish(&ctx, out);
}